

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O3

float __thiscall Assimp::XGLImporter::ReadFloat(XGLImporter *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  byte *pbVar3;
  ulong uVar4;
  byte *c;
  float t;
  float local_c;
  
  bVar1 = SkipToText(this);
  if (bVar1) {
    iVar2 = (*((this->m_reader).
               super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->_vptr_IIrrXMLReader[0xe])();
    for (c = (byte *)CONCAT44(extraout_var,iVar2); uVar4 = (ulong)*c, uVar4 < 0x21; c = c + 1) {
      if ((0x100000200U >> (uVar4 & 0x3f) & 1) == 0) {
        if ((0x3401UL >> (uVar4 & 0x3f) & 1) != 0) goto LAB_00590c83;
        break;
      }
    }
    pbVar3 = (byte *)fast_atoreal_move<float>((char *)c,&local_c,true);
    if (c != pbVar3) {
      return local_c;
    }
  }
LAB_00590c83:
  LogFunctions<Assimp::XGLImporter>::LogError((char *)0x590c88);
  return 0.0;
}

Assistant:

float XGLImporter::ReadFloat()
{
    if(!SkipToText()) {
        LogError("unexpected EOF reading float element contents");
        return 0.f;
    }
    const char* s = m_reader->getNodeData(), *se;

    if(!SkipSpaces(&s)) {
        LogError("unexpected EOL, failed to parse float");
        return 0.f;
    }

    float t;
    se = fast_atoreal_move(s,t);

    if (se == s) {
        LogError("failed to read float text");
        return 0.f;
    }

    return t;
}